

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O3

err_t cmdSigAppend(char *sig_name,cmd_sig_t *sig)

{
  err_t eVar1;
  size_t size;
  octet *buf;
  
  size = cmdSigEnc((octet *)0x0,sig);
  if (size == 0xffffffffffffffff) {
    eVar1 = 0x1fe;
  }
  else {
    buf = (octet *)blobCreate(size);
    if (buf == (octet *)0x0) {
      eVar1 = 0x6e;
    }
    else {
      cmdSigEnc(buf,sig);
      memRev(buf,size);
      eVar1 = cmdFileAppend(sig_name,buf,size);
      blobClose(buf);
    }
  }
  return eVar1;
}

Assistant:

static err_t cmdSigAppend(const char* sig_name, const cmd_sig_t* sig)
{
	err_t code;
	octet* der;
	size_t len;
	// pre
	ASSERT(cmdSigSeemsValid(sig));
	ASSERT(strIsValid(sig_name));
	// определить длину DER-кода
	len = cmdSigEnc(0, sig);
	code = len != SIZE_MAX ? ERR_OK : ERR_BAD_SIG;
	ERR_CALL_CHECK(code);
	// подготовить память
	code = cmdBlobCreate(der, len);
	ERR_CALL_CHECK(code);
	// кодировать
	cmdSigEnc(der, sig);
	memRev(der, len);
	// дописать код к файлу
	code = cmdFileAppend(sig_name, der, len);
	// завершить
	cmdBlobClose(der);
	return code;
}